

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O2

Element __thiscall ftxui::anon_unknown_3::ToggleBase::Render(ToggleBase *this)

{
  pointer *this_00;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ToggleBase *pTVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  Components *pCVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  code *pcVar9;
  ComponentBase *in_RSI;
  long lVar10;
  int iVar11;
  ulong uVar12;
  Element EVar13;
  Elements children;
  Decorator style;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_188;
  code *local_168;
  long local_160;
  ComponentBase *local_158;
  ulong local_150;
  ToggleBase *local_148;
  ComponentBase *local_140;
  pointer *local_138;
  Components *local_130;
  undefined1 local_128 [16];
  Element local_118;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  ftxui local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  ftxui local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_c8;
  undefined1 local_b0 [32];
  string local_90;
  Decorator local_70;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_50;
  
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ComponentBase::Focused(in_RSI);
  this_00 = &in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158 = in_RSI + 1;
  sVar5 = ConstStringListRef::size((ConstStringListRef *)local_158);
  local_138 = this_00;
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)this_00,sVar5);
  if (bVar4) {
    local_168 = focus;
  }
  else {
    local_168 = select;
  }
  local_130 = &in_RSI[2].children_;
  local_160 = 0;
  uVar12 = 0;
  local_148 = this;
  local_140 = in_RSI;
  while( true ) {
    sVar5 = ConstStringListRef::size((ConstStringListRef *)local_158);
    pTVar3 = local_148;
    if (sVar5 <= uVar12) break;
    local_150 = uVar12;
    if (uVar12 != 0) {
      separator();
      std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
      emplace_back<std::shared_ptr<ftxui::Node>>
                ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>
                  *)&local_188,(shared_ptr<ftxui::Node> *)local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    }
    uVar12 = local_150;
    pCVar7 = (Components *)
             in_RSI[7].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar7 == (Components *)0x0) {
      pCVar7 = local_130;
    }
    p_Var2 = (((pointer)(pCVar7 + 8))->
             super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pCVar7 + 8);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var8 = p_Var2;
    }
    iVar11 = (int)local_150;
    iVar1 = *(int *)&((in_RSI[1].children_.
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    lVar6 = (ulong)(iVar11 == *(int *)&((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                         *)&p_Var8->_vptr__Sp_counted_base)->_M_ptr && bVar4) * 0x20
    ;
    lVar10 = lVar6 + 0x40;
    if (iVar11 != iVar1) {
      lVar10 = lVar6;
    }
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_b0,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               ((long)&(pCVar7->
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar10));
    pcVar9 = local_168;
    if (iVar11 != iVar1) {
      pcVar9 = nothing;
    }
    ConstStringListRef::operator[][abi_cxx11_(&local_90,(ConstStringListRef *)local_158,uVar12);
    text((string *)local_128);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_50,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)local_b0);
    operator|(local_e8,(Element *)local_128,&local_50);
    local_108._8_8_ = 0;
    local_f0 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_manager;
    local_108._M_unused._M_object = pcVar9;
    operator|((ftxui *)&local_118,(Element *)local_e8,(Decorator *)&local_108);
    reflect((Box *)((long)&((*local_138)->
                           super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + local_160));
    in_RSI = local_140;
    operator|(local_d8,&local_118,&local_70);
    std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
    emplace_back<std::shared_ptr<ftxui::Node>>
              ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>> *)
               &local_188,(shared_ptr<ftxui::Node> *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_118.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    std::__cxx11::string::~string((string *)&local_90);
    std::_Function_base::~_Function_base((_Function_base *)local_b0);
    uVar12 = local_150 + 1;
    local_160 = local_160 + 0x10;
  }
  local_c8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_188.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_188.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_c8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_188.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hbox((Elements *)local_148);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_c8);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_188);
  EVar13.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar13.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pTVar3
  ;
  return (Element)EVar13.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Elements children;
    bool is_toggle_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      // Separator.
      if (i != 0)
        children.push_back(separator());

      bool is_focused = (focused_entry() == int(i)) && is_toggle_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected        ? nothing
                              : is_toggle_focused ? focus
                                                  : select;
      children.push_back(text(entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return hbox(std::move(children));
  }